

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

value * __thiscall cppcms::json::value::find(value *this,char *cpath)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
  *this_00;
  const_iterator cVar4;
  char *pcVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  string_key path;
  key_type local_98;
  char *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(cpath + -1);
  do {
    pcVar5 = local_58->_M_local_buf + 1;
    local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_58->_M_local_buf + 1);
  } while (*pcVar5 != '\0');
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = '\0';
  local_60 = cpath;
  if ((find(char_const*)::empty == '\0') &&
     (iVar2 = __cxa_guard_acquire(&find(char_const*)::empty), iVar2 != 0)) {
    copyable::copyable(&find::empty.d);
    __cxa_atexit(~value,&find::empty,&__dso_handle);
    __cxa_guard_release(&find(char_const*)::empty);
  }
  paVar1 = &local_98.key_.field_2;
  uVar10 = 0;
  do {
    pcVar5 = local_60;
    local_98.end_ = (char *)local_58;
    if (local_60 == (char *)0x0) {
      pcVar5 = local_50;
      local_98.end_ = (char *)(local_50 + local_48);
    }
    uVar7 = (long)local_98.end_ - (long)pcVar5;
    uVar8 = 0xffffffffffffffff;
    uVar9 = uVar10;
    if (uVar10 < uVar7) {
      do {
        uVar8 = uVar9;
        if (pcVar5[uVar9] == '.') break;
        uVar8 = uVar9 + 1;
        uVar9 = uVar8;
      } while (uVar8 <= uVar7);
      if (uVar7 <= uVar8) {
        uVar8 = 0xffffffffffffffff;
      }
    }
    if (uVar10 < uVar7) {
      local_98.begin_ = pcVar5 + uVar10;
      if (uVar8 - uVar10 <= (ulong)((long)local_98.end_ - (long)local_98.begin_)) {
        local_98.end_ = pcVar5 + uVar8;
      }
    }
    else {
      local_98.begin_ = (char *)0x0;
      local_98.end_ = (char *)0x0;
    }
    local_98.key_._M_string_length = 0;
    local_98.key_.field_2._M_local_buf[0] = '\0';
    uVar8 = uVar8 + 1;
    if (uVar8 == 0) {
      uVar8 = 0xffffffffffffffff;
    }
    paVar3 = paVar1;
    paVar6 = paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.begin_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_98.begin_;
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_98.end_;
    }
    local_98.key_._M_dataplus._M_p = (pointer)paVar1;
    if ((paVar6 == paVar3) || ((*(variant **)this)->type != is_object)) {
      bVar11 = false;
    }
    else {
      this_00 = &variant::
                 get<std::map<cppcms::string_key,cppcms::json::value,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>>
                           (*(variant **)this)->_M_t;
      cVar4 = std::
              _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
              ::find(this_00,&local_98);
      bVar11 = (_Rb_tree_header *)cVar4._M_node != &(this_00->_M_impl).super__Rb_tree_header;
      if (bVar11) {
        this = (value *)&cVar4._M_node[2]._M_left;
        uVar10 = uVar8;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.key_._M_dataplus._M_p != paVar1) {
      operator_delete(local_98.key_._M_dataplus._M_p);
    }
    if (!bVar11) {
      this = &find::empty;
      goto LAB_001eeae6;
    }
    pcVar5 = local_60;
    paVar3 = local_58;
    if (local_60 == (char *)0x0) {
      pcVar5 = local_50;
      paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_50 + local_48);
    }
    if ((ulong)((long)paVar3 - (long)pcVar5) <= uVar8) {
LAB_001eeae6:
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      return (value *)(_Base_ptr *)this;
    }
  } while( true );
}

Assistant:

value const &value::find(char const *cpath) const
	{
		string_key path=string_key::unowned(cpath);
		static value const empty;
		value const *ptr=this;
		size_t pos=0;
		size_t new_pos;
		do {
			new_pos=path.find('.',pos);
			string_key const part=path.unowned_substr(pos,new_pos - pos);
			if(new_pos!=std::string::npos)
				new_pos++;
			if(part.empty())
				return empty;
			if(ptr->type()!=json::is_object)
				return empty;
			json::object const &obj=ptr->object();
			json::object::const_iterator p;
			if((p=obj.find(part))==obj.end())
				return empty;
			ptr=&p->second;
			pos=new_pos;

		} while(new_pos < path.size());
		return *ptr;
	}